

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<sax_event_t,sax_event_t>
          (internal *this,char *expected_expression,char *actual_expression,sax_event_t *expected,
          sax_event_t *actual)

{
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar1;
  int iVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar4;
  undefined1 local_48 [16];
  pointer local_38;
  
  if (expected->type == actual->type) {
    switch(expected->type) {
    case comment:
    case key:
    case string:
    case datetime:
      __n = (expected->string_data)._M_string_length;
      if ((__n != (actual->string_data)._M_string_length) ||
         ((__n != 0 &&
          (iVar2 = bcmp((expected->string_data)._M_dataplus._M_p,
                        (actual->string_data)._M_dataplus._M_p,__n), iVar2 != 0))))
      goto LAB_00166546;
      break;
    case table:
    case table_array_item:
      __first1 = (expected->keys).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      __last1 = (expected->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __first2 = (actual->keys).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (((long)__last1 - (long)__first1 !=
           (long)(actual->keys).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) ||
         (bVar1 = std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (__first1,__last1,__first2), !bVar1)) goto LAB_00166546;
      break;
    case finish_array:
    case finish_inline_table:
    case integer:
      if (expected->int_data != actual->int_data) goto LAB_00166546;
      break;
    case boolean:
      if (expected->bool_data != actual->bool_data) goto LAB_00166546;
      break;
    case floating_point:
      if ((expected->float_data != actual->float_data) ||
         (NAN(expected->float_data) || NAN(actual->float_data))) goto LAB_00166546;
    }
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
LAB_00166546:
    FormatForComparisonFailureMessage<sax_event_t,sax_event_t>
              ((sax_event_t *)&stack0xffffffffffffffc8,expected);
    FormatForComparisonFailureMessage<sax_event_t,sax_event_t>((sax_event_t *)local_48,actual);
    AVar4 = EqFailure(this,expected_expression,actual_expression,(String *)&stack0xffffffffffffffc8,
                      (String *)local_48,false);
    sVar3 = AVar4.message_.ptr_;
    if ((char *)local_48._0_8_ != (char *)0x0) {
      operator_delete__((void *)local_48._0_8_);
      sVar3.ptr_ = extraout_RDX;
    }
    if (local_38 != (pointer)0x0) {
      operator_delete__(local_38);
      sVar3.ptr_ = extraout_RDX_00;
    }
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}